

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimapper.cpp
# Opt level: O0

void __thiscall rtosc::MidiMappernRT::snoop_bToU(MidiMappernRT *this,char *msg)

{
  _Tuple_impl<2UL,_int,_rtosc::MidiBijection> *p_Var1;
  bool bVar2;
  int v;
  mapped_type *pmVar3;
  char *__s;
  __tuple_element_t<1UL,_tuple<int,_int,_int,_MidiBijection>_> *p_Var4;
  __tuple_element_t<2UL,_tuple<int,_int,_int,_MidiBijection>_> *p_Var5;
  char *in_RSI;
  rtosc_arg_t rVar6;
  int new_midi;
  string args;
  float value;
  MidiBijection bi;
  mapped_type apple;
  int in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  int in_stack_fffffffffffffe10;
  undefined2 in_stack_fffffffffffffe14;
  undefined1 in_stack_fffffffffffffe16;
  undefined1 in_stack_fffffffffffffe17;
  string *in_stack_fffffffffffffe18;
  uint idx;
  MidiMappernRT *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  key_type *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int local_130;
  float local_120;
  undefined1 local_109 [37];
  float local_e4;
  MidiBijection local_e0;
  allocator<char> local_c9;
  string local_c8 [32];
  MidiBijection local_a8;
  allocator<char> local_99;
  string local_98 [32];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  _Self local_58 [3];
  allocator<char> local_39;
  string local_38 [32];
  _Self local_18;
  char *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),(key_type *)0x129788)
  ;
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  bVar2 = std::operator!=(&local_18,local_58);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  if (!bVar2) {
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
                         *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  local_68 = *(undefined8 *)
              &(pmVar3->super__Tuple_impl<0UL,_int,_int,_int,_rtosc::MidiBijection>).
               super__Tuple_impl<1UL,_int,_int,_rtosc::MidiBijection>.
               super__Head_base<1UL,_int,_false>;
  p_Var1 = &(pmVar3->super__Tuple_impl<0UL,_int,_int,_int,_rtosc::MidiBijection>).
            super__Tuple_impl<1UL,_int,_int,_rtosc::MidiBijection>.
            super__Tuple_impl<2UL,_int,_rtosc::MidiBijection>;
  local_78._0_4_ =
       (p_Var1->super__Tuple_impl<3UL,_rtosc::MidiBijection>).
       super__Head_base<3UL,_rtosc::MidiBijection,_false>._M_head_impl.mode;
  local_78._4_4_ =
       (p_Var1->super__Tuple_impl<3UL,_rtosc::MidiBijection>).
       super__Head_base<3UL,_rtosc::MidiBijection,_false>._M_head_impl.min;
  uStack_70 = *(undefined8 *)
               &(pmVar3->super__Tuple_impl<0UL,_int,_int,_int,_rtosc::MidiBijection>).
                super__Tuple_impl<1UL,_int,_int,_rtosc::MidiBijection>.
                super__Tuple_impl<2UL,_int,_rtosc::MidiBijection>.
                super__Tuple_impl<3UL,_rtosc::MidiBijection>.
                super__Head_base<3UL,_rtosc::MidiBijection,_false>._M_head_impl.max;
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  local_e0 = getBijection(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  idx = (uint)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  local_a8 = local_e0;
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  local_e4 = 0.0;
  __s = rtosc_argument_string(local_10);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,__s,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  std::allocator<char>::~allocator((allocator<char> *)local_109);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffe17,
                                   CONCAT16(in_stack_fffffffffffffe16,
                                            CONCAT24(in_stack_fffffffffffffe14,
                                                     in_stack_fffffffffffffe10))),
                          (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  if (bVar2) {
    rVar6 = rtosc_argument((char *)in_stack_fffffffffffffe20,idx);
    local_120 = rVar6.f;
    local_e4 = local_120;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffe17,
                                     CONCAT16(in_stack_fffffffffffffe16,
                                              CONCAT24(in_stack_fffffffffffffe14,
                                                       in_stack_fffffffffffffe10))),
                            (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    if (bVar2) {
      rVar6 = rtosc_argument((char *)in_stack_fffffffffffffe20,idx);
      local_130 = rVar6.i;
      local_e4 = (float)local_130;
    }
    else {
      in_stack_fffffffffffffe17 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffe17,
                                    CONCAT16(in_stack_fffffffffffffe16,
                                             CONCAT24(in_stack_fffffffffffffe14,
                                                      in_stack_fffffffffffffe10))),
                           (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      if ((bool)in_stack_fffffffffffffe17) {
        local_e4 = 1.0;
      }
      else {
        in_stack_fffffffffffffe16 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffe17,
                                      CONCAT16(in_stack_fffffffffffffe16,
                                               CONCAT24(in_stack_fffffffffffffe14,
                                                        in_stack_fffffffffffffe10))),
                             (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        if (!(bool)in_stack_fffffffffffffe16) goto LAB_00129cd0;
        local_e4 = 0.0;
      }
    }
  }
  v = MidiBijection::operator()(&local_a8,local_e4);
  p_Var4 = std::get<1ul,int,int,int,rtosc::MidiBijection>
                     ((tuple<int,_int,_int,_rtosc::MidiBijection> *)0x129c50);
  if (*p_Var4 != -1) {
    in_stack_fffffffffffffe10 = v;
    std::get<1ul,int,int,int,rtosc::MidiBijection>
              ((tuple<int,_int,_int,_rtosc::MidiBijection> *)0x129c6d);
    apply_high((MidiMappernRT *)
               CONCAT17(in_stack_fffffffffffffe17,
                        CONCAT16(in_stack_fffffffffffffe16,
                                 CONCAT24(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10))),
               in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08);
  }
  p_Var5 = std::get<2ul,int,int,int,rtosc::MidiBijection>
                     ((tuple<int,_int,_int,_rtosc::MidiBijection> *)0x129c91);
  if (*p_Var5 != -1) {
    std::get<2ul,int,int,int,rtosc::MidiBijection>
              ((tuple<int,_int,_int,_rtosc::MidiBijection> *)0x129cae);
    apply_low((MidiMappernRT *)
              CONCAT17(in_stack_fffffffffffffe17,
                       CONCAT16(in_stack_fffffffffffffe16,
                                CONCAT24(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10))),v,
              in_stack_fffffffffffffe08);
  }
LAB_00129cd0:
  std::__cxx11::string::~string((string *)(local_109 + 1));
  return;
}

Assistant:

void MidiMappernRT::snoop_bToU(const char *msg)
{

    if(inv_map.find(msg) != inv_map.end())
    {
        auto apple = inv_map[msg];
        MidiBijection bi = getBijection(msg);
        float value = 0;
        std::string args = rtosc_argument_string(msg);
        if(args == "f")
            value = rtosc_argument(msg, 0).f;
        else if(args == "i")
            value = rtosc_argument(msg, 0).i;
        else if(args == "T")
            value = 1.0;
        else if(args == "F")
            value = 0.0;
        else
            return;

        int new_midi = bi(value);
        if(std::get<1>(apple) != -1)
            apply_high(new_midi,std::get<1>(apple));
        if(std::get<2>(apple) != -1)
            apply_low(new_midi,std::get<2>(apple));
    }
}